

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.h
# Opt level: O0

void testing::internal::UniversalTersePrinter<const_wchar_t_*>::Print(wchar_t *str,ostream *os)

{
  allocator<wchar_t> local_39;
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> local_38;
  ostream *local_18;
  ostream *os_local;
  wchar_t *str_local;
  
  local_18 = os;
  os_local = (ostream *)str;
  if (str == (wchar_t *)0x0) {
    std::operator<<(os,"NULL");
  }
  else {
    std::allocator<wchar_t>::allocator();
    std::__cxx11::wstring::wstring<std::allocator<wchar_t>>((wstring *)&local_38,str,&local_39);
    UniversalPrint<std::__cxx11::wstring>(&local_38,local_18);
    std::__cxx11::wstring::~wstring((wstring *)&local_38);
    std::allocator<wchar_t>::~allocator(&local_39);
  }
  return;
}

Assistant:

static void Print(const wchar_t* str, ::std::ostream* os) {
    if (str == NULL) {
      *os << "NULL";
    } else {
      UniversalPrint(::std::wstring(str), os);
    }
  }